

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_threading_pthreads.cpp
# Opt level: O0

void __thiscall crnlib::task_pool::join(task_pool *this)

{
  bool bVar1;
  atomic32_t aVar2;
  undefined1 local_30 [4];
  int total_submitted_tasks;
  task tsk;
  task_pool *this_local;
  
  tsk._24_8_ = this;
  task::task((task *)local_30);
  while( true ) {
    bVar1 = tsstack<crnlib::task_pool::task,_16U>::pop(&this->m_task_stack,(task *)local_30);
    if (!bVar1) break;
    process_task(this,(task *)local_30);
  }
  aVar2 = atomic_add32(&this->m_total_submitted_tasks,0);
  while (this->m_total_completed_tasks != (long)(int)aVar2) {
    semaphore::wait(&this->m_all_tasks_completed,(void *)0x1);
  }
  return;
}

Assistant:

void task_pool::join()
    {
        // Try to steal any outstanding tasks. This could cause one or more worker threads to wake up and immediately go back to sleep, which is wasteful but should be harmless.
        task tsk;
        while (m_task_stack.pop(tsk))
        {
            process_task(tsk);
        }

        // At this point the task stack is empty.
        // Now wait for all concurrent tasks to complete. The m_all_tasks_completed semaphore has a max count of 1, so it's possible it could have saturated to 1 as the tasks
        // where issued and asynchronously completed, so this loop may iterate a few times.
        const int total_submitted_tasks = atomic_add32(&m_total_submitted_tasks, 0);
        while (m_total_completed_tasks != total_submitted_tasks)
        {
            // If the previous (m_total_completed_tasks != total_submitted_tasks) check failed the semaphore MUST be eventually signalled once the last task completes.
            // So I think this can actually be an INFINITE delay, but it shouldn't really matter if it's 1ms.
            m_all_tasks_completed.wait(1);
        }
    }